

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

GLFWbool waitForAnyEvent(double *timeout)

{
  uint uVar1;
  ulong uVar2;
  pollfd fds [3];
  pollfd local_38;
  int local_30;
  undefined8 local_2c;
  undefined4 local_24;
  
  local_38.fd = *(int *)(_glfw.x11.display + 0x10);
  local_38.events = 1;
  local_38.revents = 0;
  local_30 = _glfw.x11.emptyEventPipe[0];
  local_2c = 0xffffffff00000001;
  local_24 = 1;
  if (_glfw.joysticksInitialized != 0) {
    local_2c = CONCAT44(_glfw.linjs.inotify,1);
  }
  uVar1 = (*_glfw.x11.xlib.Pending)(_glfw.x11.display);
  uVar2 = (ulong)uVar1;
  if (uVar1 == 0) {
    while( true ) {
      uVar1 = _glfwPollPOSIX(&local_38,3,timeout);
      uVar2 = (ulong)uVar1;
      if (uVar1 == 0) break;
      uVar2 = 0;
      do {
        if ((*(byte *)((long)&local_2c + uVar2 * 8 + 2) & 1) != 0) goto LAB_001203e3;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 2);
      uVar1 = (*_glfw.x11.xlib.Pending)(_glfw.x11.display);
      uVar2 = (ulong)uVar1;
      if (uVar1 != 0) break;
    }
  }
LAB_001203e3:
  return (GLFWbool)uVar2;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    enum { XLIB_FD, PIPE_FD, INOTIFY_FD };
    struct pollfd fds[] =
    {
        [XLIB_FD] = { ConnectionNumber(_glfw.x11.display), POLLIN },
        [PIPE_FD] = { _glfw.x11.emptyEventPipe[0], POLLIN },
        [INOTIFY_FD] = { -1, POLLIN }
    };

#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        fds[INOTIFY_FD].fd = _glfw.linjs.inotify;
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
            return GLFW_FALSE;

        for (int i = 1; i < sizeof(fds) / sizeof(fds[0]); i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}